

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_string_ptr(char *str,printbuffer *p)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  void *pvVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  if (str == (char *)0x0) {
    if (p == (printbuffer *)0x0) {
      pcVar5 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar5 = ensure(p,3);
    }
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = '\0';
      pcVar5[0] = '\"';
      pcVar5[1] = '\"';
      return pcVar5;
    }
  }
  else {
    lVar9 = 0;
    bVar3 = false;
    for (lVar7 = 0; bVar2 = str[lVar7], bVar2 != 0; lVar7 = lVar7 + 1) {
      bVar3 = (bool)(bVar3 | ((bVar2 == 0x5c || bVar2 == 0x22) || bVar2 < 0x20));
      lVar9 = lVar9 + 0x100000000;
    }
    if (bVar3) {
      iVar10 = 0;
      for (pbVar6 = (byte *)str; bVar2 = *pbVar6, bVar2 != 0; pbVar6 = pbVar6 + 1) {
        if (iVar10 + 1 == 0) {
          iVar10 = 0;
          break;
        }
        pvVar4 = memchr("\"\\\b\f\n\r\t",(uint)bVar2,8);
        iVar1 = iVar10 + 2;
        iVar8 = iVar10 + 1;
        if (bVar2 < 0x20) {
          iVar8 = iVar10 + 6;
        }
        iVar10 = iVar8;
        if (pvVar4 != (void *)0x0) {
          iVar10 = iVar1;
        }
      }
      if (p == (printbuffer *)0x0) {
        pcVar5 = (char *)(*cJSON_malloc)((long)(iVar10 + 3));
      }
      else {
        pcVar5 = ensure(p,iVar10 + 3);
      }
      if (pcVar5 != (char *)0x0) {
        pbVar6 = (byte *)(pcVar5 + 1);
        *pcVar5 = '\"';
        do {
          bVar2 = *str;
          if (bVar2 == 0) {
            pbVar6[0] = 0x22;
            pbVar6[1] = 0;
            return pcVar5;
          }
          if (((bVar2 < 0x20) || (bVar2 == 0x22)) || (bVar2 == 0x5c)) {
            *pbVar6 = 0x5c;
            bVar2 = *str;
            switch(bVar2) {
            case 8:
              pbVar6[1] = 0x62;
              break;
            case 9:
              pbVar6[1] = 0x74;
              break;
            case 10:
              pbVar6[1] = 0x6e;
              break;
            case 0xb:
switchD_001046da_caseD_b:
              sprintf((char *)(pbVar6 + 1),"u%04x");
              pbVar6 = pbVar6 + 6;
              goto LAB_0010473e;
            case 0xc:
              pbVar6[1] = 0x66;
              break;
            case 0xd:
              pbVar6[1] = 0x72;
              break;
            default:
              if (bVar2 == 0x22) {
                pbVar6[1] = 0x22;
              }
              else {
                if (bVar2 != 0x5c) goto switchD_001046da_caseD_b;
                pbVar6[1] = 0x5c;
              }
            }
            pbVar6 = pbVar6 + 2;
          }
          else {
            *pbVar6 = bVar2;
            pbVar6 = pbVar6 + 1;
          }
LAB_0010473e:
          str = (char *)((byte *)str + 1);
        } while( true );
      }
    }
    else {
      if (p == (printbuffer *)0x0) {
        pcVar5 = (char *)(*cJSON_malloc)(lVar9 + 0x300000000 >> 0x20);
      }
      else {
        pcVar5 = ensure(p,(int)lVar7 + 3);
      }
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\"';
        strcpy(pcVar5 + 1,str);
        pcVar5[(lVar9 >> 0x20) + 1] = '\"';
        pcVar5[(lVar9 + 0x100000000 >> 0x20) + 1] = '\0';
        return pcVar5;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_string_ptr(const char *str,printbuffer *p)
{
	const char *ptr;char *ptr2,*out;int len=0,flag=0;unsigned char token;

	if (!str)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (!out) return 0;
		strcpy(out,"\"\"");
		return out;
	}
	
	for (ptr=str;*ptr;ptr++) flag|=((*ptr>0 && *ptr<32)||(*ptr=='\"')||(*ptr=='\\'))?1:0;
	if (!flag)
	{
		len=(int)(ptr-str);
		if (p) out=ensure(p,len+3);
		else		out=(char*)cJSON_malloc(len+3);
		if (!out) return 0;
		ptr2=out;*ptr2++='\"';
		strcpy(ptr2,str);
		ptr2[len]='\"';
		ptr2[len+1]=0;
		return out;
	}
	
	ptr=str;while ((token=*ptr) && ++len) {if (strchr("\"\\\b\f\n\r\t",token)) len++; else if (token<32) len+=5;ptr++;}
	
	if (p)	out=ensure(p,len+3);
	else	out=(char*)cJSON_malloc(len+3);
	if (!out) return 0;

	ptr2=out;ptr=str;
	*ptr2++='\"';
	while (*ptr)
	{
		if ((unsigned char)*ptr>31 && *ptr!='\"' && *ptr!='\\') *ptr2++=*ptr++;
		else
		{
			*ptr2++='\\';
			switch (token=*ptr++)
			{
				case '\\':	*ptr2++='\\';	break;
				case '\"':	*ptr2++='\"';	break;
				case '\b':	*ptr2++='b';	break;
				case '\f':	*ptr2++='f';	break;
				case '\n':	*ptr2++='n';	break;
				case '\r':	*ptr2++='r';	break;
				case '\t':	*ptr2++='t';	break;
				default: sprintf(ptr2,"u%04x",token);ptr2+=5;	break;	/* escape and print */
			}
		}
	}
	*ptr2++='\"';*ptr2++=0;
	return out;
}